

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

Option * docopt::Option::parse(Option *__return_storage_ptr__,string *option_description)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  pointer psVar5;
  long *plVar6;
  pointer psVar7;
  undefined8 *puVar8;
  char *pcVar9;
  ulong *puVar10;
  long lVar11;
  string *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __b;
  string m;
  sregex_iterator i;
  string longOption;
  string shortOption;
  smatch match;
  Kind local_208;
  undefined1 local_200 [24];
  pointer psStack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  ulong local_1d0;
  long lStack_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [8];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  element_type *peStack_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  pointer psStack_198;
  pointer local_190;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  Option *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_130;
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  pointer psStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [8];
  undefined1 local_e8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string *local_c0;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  pointer local_58;
  pointer psStack_50;
  pointer local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  
  local_110 = &local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_158 = &local_148;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_208 = Bool;
  local_200._0_8_ = local_200._0_8_ & 0xffffffffffffff00;
  local_138 = __return_storage_ptr__;
  sVar4 = std::__cxx11::string::find((char *)option_description,0x19bd69,0);
  if (sVar4 == 0xffffffffffffffff) {
    sVar4 = option_description->_M_string_length;
  }
  __b._M_current = (option_description->_M_dataplus)._M_p + sVar4;
  if ((parse(std::__cxx11::string_const&)::pattern_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_),
     iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,"(--|-)?(.*?)([,= ]|$)",0x10)
    ;
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_);
  }
  local_c8._M_current = __b._M_current;
  local_c0 = option_description;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)local_1b8,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(option_description->_M_dataplus)._M_p,__b,
                   &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,0x20);
  local_48 = (pointer)0x0;
  _Stack_40._M_current = (char *)0x0;
  local_58 = (pointer)0x0;
  psStack_50 = (pointer)0x0;
  local_78._16_8_ = (regex_type *)0x0;
  local_78._24_8_ = (char *)0x0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = (char *)0x0;
  local_1c0 = 0;
  while (bVar2 = std::__cxx11::
                 regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                 ::operator==((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                               *)local_1b8,
                              (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                               *)local_78), !bVar2) {
    if (psStack_198 == local_190) {
      bVar2 = false;
    }
    else {
      bVar2 = ((long)local_190 - (long)psStack_198 >> 3) * -0x5555555555555555 - 5U <
              0xfffffffffffffffe;
    }
    psVar7 = local_190 + -3;
    psVar5 = psStack_198 + 1;
    if (!bVar2) {
      psVar5 = psVar7;
    }
    lVar11 = (long)local_190 - (long)psStack_198 >> 3;
    if (psVar5->matched == true) {
      psVar5 = psVar7;
      if ((psStack_198 != local_190) &&
         (psVar5 = psStack_198 + 1, 0xfffffffffffffffd < lVar11 * -0x5555555555555555 - 5U)) {
        psVar5 = psVar7;
      }
      local_178 = local_168;
      if ((psVar5->matched == true) &&
         ((long)(psVar5->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).second._M_current -
          (long)(psVar5->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).first._M_current == 1)) {
        if (psStack_198 != local_190 && lVar11 * -0x5555555555555555 - 6U < 0xfffffffffffffffd) {
          psVar7 = psStack_198 + 2;
        }
        if (psVar7->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_178,
                     (psVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_170 = 0;
          local_168[0] = 0;
        }
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x199877);
        puVar10 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar10) {
          local_1d0 = *puVar10;
          lStack_1c8 = puVar8[3];
          local_1e0._M_allocated_capacity = (size_type)&local_1d0;
        }
        else {
          local_1d0 = *puVar10;
          local_1e0._M_allocated_capacity = (size_type)(ulong *)*puVar8;
        }
        local_1e0._8_8_ = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        this = (string *)&local_110;
      }
      else {
        if (psStack_198 != local_190 && lVar11 * -0x5555555555555555 - 6U < 0xfffffffffffffffd) {
          psVar7 = psStack_198 + 2;
        }
        if (psVar7->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_178,
                     (psVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar7->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_170 = 0;
          local_168[0] = 0;
        }
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x199876);
        puVar10 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar10) {
          local_1d0 = *puVar10;
          lStack_1c8 = plVar6[3];
          local_1e0._M_allocated_capacity = (size_type)&local_1d0;
        }
        else {
          local_1d0 = *puVar10;
          local_1e0._M_allocated_capacity = (size_type)(ulong *)*plVar6;
        }
        local_1e0._8_8_ = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        this = (string *)&local_158;
      }
      std::__cxx11::string::operator=(this,(string *)local_1e0._M_local_buf);
      if ((ulong *)local_1e0._M_allocated_capacity != &local_1d0) {
        operator_delete((void *)local_1e0._M_allocated_capacity);
      }
      if (local_178 != local_168) {
        operator_delete(local_178);
      }
    }
    else {
      psVar5 = psStack_198 + 2;
      if (psStack_198 == local_190 || 0xfffffffffffffffc < lVar11 * -0x5555555555555555 - 6U) {
        psVar5 = psVar7;
      }
      if ((psVar5->matched == true) &&
         (0 < (long)(psVar5->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).second._M_current -
              (long)(psVar5->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).first._M_current)) {
        psVar5 = psVar7;
        if ((psStack_198 != local_190) &&
           (psVar5 = psStack_198 + 2, 0xfffffffffffffffc < lVar11 * -0x5555555555555555 - 6U)) {
          psVar5 = psVar7;
        }
        if (psVar5->matched == true) {
          local_1e0._M_allocated_capacity = (size_type)&local_1d0;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1e0,
                     (psVar5->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar5->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_1e0._8_8_ = 0;
          local_1d0 = local_1d0 & 0xffffffffffffff00;
          local_1e0._M_allocated_capacity = (size_type)&local_1d0;
        }
        if ((ulong *)local_1e0._M_allocated_capacity != &local_1d0) {
          operator_delete((void *)local_1e0._M_allocated_capacity);
        }
        local_1c0 = 1;
      }
    }
    if (psStack_198 == local_190) {
      bVar2 = false;
    }
    else {
      bVar2 = ((long)local_190 - (long)psStack_198 >> 3) * -0x5555555555555555 - 7U <
              0xfffffffffffffffc;
    }
    if (bVar2) {
      psVar7 = psStack_198 + 3;
    }
    else {
      psVar7 = local_190 + -3;
    }
    if ((psVar7->matched != true) ||
       ((psVar7->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).second._M_current ==
        (psVar7->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).first._M_current)) break;
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_1b8);
  }
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  if (psStack_198 != (pointer)0x0) {
    operator_delete(psStack_198);
  }
  if ((int)local_1c0 != 0) {
    local_78._16_8_ = (regex_type *)0x0;
    local_78._24_8_ = (char *)0x0;
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = (char *)0x0;
    pcVar1 = (local_c0->_M_dataplus)._M_p;
    sVar4 = local_c0->_M_string_length;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,
               "\\[default: (.*)\\]",1);
    bVar2 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (local_c8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(pcVar1 + sVar4),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_78,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8
                       ,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
    if (bVar2) {
      if (local_78._0_8_ == local_78._8_8_) {
        bVar2 = false;
      }
      else {
        bVar2 = ((long)(local_78._8_8_ - local_78._0_8_) >> 3) * -0x5555555555555555 - 5U <
                0xfffffffffffffffe;
      }
      pcVar9 = (char *)(local_78._8_8_ + -0x48);
      if (bVar2) {
        pcVar9 = (char *)(local_78._0_8_ + 0x18);
      }
      local_130 = &local_120;
      if (pcVar9[0x10] == '\x01') {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_130,*(undefined8 *)pcVar9,*(undefined8 *)(pcVar9 + 8));
      }
      else {
        local_128 = (element_type *)0x0;
        local_120._M_pi._0_1_ = 0;
      }
      peStack_1a8 = local_128;
      if (local_130 == &local_120) {
        psStack_198 = psStack_118;
        local_1b0._M_current = (char *)&local_1a0;
      }
      else {
        local_1b0._M_current = (char *)local_130;
      }
      local_1a0._M_pi._1_7_ = local_120._M_pi._1_7_;
      local_1a0._M_pi._0_1_ = local_120._M_pi._0_1_;
      local_120._M_pi._0_1_ = 0;
      local_128 = (element_type *)0x0;
      local_1b8._0_4_ = 3;
      local_208 = String;
      switch(0x17e7cb) {
      case 0:
        local_200[0] = local_1b0._M_current._0_1_;
        break;
      case 1:
        local_200._0_8_ = local_1b0._M_current;
        break;
      case 2:
        local_200._0_8_ = local_200 + 0x10;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_current == &local_1a0) {
          psStack_1e8 = psStack_198;
        }
        else {
          local_200._0_8_ = local_1b0._M_current;
        }
        local_200._16_8_ = local_1a0._M_pi;
        local_200._8_8_ = peStack_1a8;
        peStack_1a8 = (element_type *)0x0;
        local_1a0._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_120._M_pi._1_7_ << 8);
        local_1b0._M_current = (char *)&local_1a0;
        break;
      case 3:
        local_200._0_8_ = local_1b0._M_current;
        local_200._8_8_ = peStack_1a8;
        local_200._16_8_ = local_1a0._M_pi;
        local_1b0._M_current = (char *)0x0;
        peStack_1a8 = (element_type *)0x0;
        local_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      local_130 = &local_120;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_current != &local_1a0) {
        operator_delete(local_1b0._M_current);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130);
      }
    }
    if ((char *)local_78._0_8_ != (char *)0x0) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  if (local_110 == &local_100) {
    local_98.field_2._8_8_ = local_100._8_8_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_110;
  }
  local_98.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
  local_98.field_2._M_local_buf[0] = local_100._M_local_buf[0];
  local_98._M_string_length = local_108;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  if (local_158 == &local_148) {
    local_b8.field_2._8_8_ = local_148._8_8_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)local_158;
  }
  local_b8.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_b8.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_b8._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_f0._0_4_ = local_208;
  switch(local_208) {
  case Bool:
    local_e8[0] = local_200[0];
    break;
  case Long:
    local_e8._0_8_ = local_200._0_8_;
    break;
  case String:
    local_e8._0_8_ = local_e8 + 0x10;
    if ((pointer)local_200._0_8_ == (pointer)(local_200 + 0x10)) {
      local_e8._24_8_ = psStack_1e8;
    }
    else {
      local_e8._0_8_ = local_200._0_8_;
    }
    local_e8._16_8_ = local_200._16_8_;
    local_e8._8_8_ = local_200._8_8_;
    local_200._8_8_ = (element_type *)0x0;
    local_200._16_8_ = local_200._16_8_ & 0xffffffffffffff00;
    local_200._0_8_ = (pointer)(local_200 + 0x10);
    break;
  case StringList:
    local_e8._0_8_ = local_200._0_8_;
    local_e8._8_8_ = local_200._8_8_;
    local_e8._16_8_ = local_200._16_8_;
    local_200._0_8_ = (pointer)0x0;
    local_200._8_8_ = (element_type *)0x0;
    local_200._16_8_ = (pointer)0x0;
  }
  local_158 = &local_148;
  local_110 = &local_100;
  Option(local_138,&local_98,&local_b8,(int)local_1c0,(value *)local_f0);
  if (local_f0._0_4_ == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
  }
  else if ((local_f0._0_4_ == String) && ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10))) {
    operator_delete((void *)local_e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_208 == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_200);
  }
  else if ((local_208 == String) && ((pointer)local_200._0_8_ != (pointer)(local_200 + 0x10))) {
    operator_delete((void *)local_200._0_8_);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  return local_138;
}

Assistant:

Option Option::parse(std::string const& option_description)
{
	std::string shortOption, longOption;
	int argcount = 0;
	value val { false };
	
	auto double_space = option_description.find("  ");
	auto options_end = option_description.end();
	if (double_space != std::string::npos) {
		options_end = option_description.begin() + double_space;
	}
	
	static const std::regex pattern {"(--|-)?(.*?)([,= ]|$)"};
	for(std::sregex_iterator i {option_description.begin(), options_end, pattern, std::regex_constants::match_not_null},
	       e{};
	    i != e;
	    ++i)
	{
		std::smatch const& match = *i;
		if (match[1].matched) { // [1] is optional.
			if (match[1].length()==1) {
				shortOption = "-" + match[2].str();
			} else {
				longOption =  "--" + match[2].str();
			}
		} else if (match[2].length() > 0) { // [2] always matches.
			std::string m = match[2];
			argcount = 1;
		} else {
			// delimeter
		}

		if (match[3].length() == 0) { // [3] always matches.
			// Hit end of string. For some reason 'match_not_null' will let us match empty
			// at the end, and then we'll spin in an infinite loop. So, if we hit an empty
			// match, we know we must be at the end.
			break;
		}
	}

	if (argcount) {
		std::smatch match;
		if (std::regex_search(options_end, option_description.end(),
				      match,
				      std::regex{"\\[default: (.*)\\]", std::regex::icase}))
		{
			val = match[1].str();
		}
	}
	
	return {std::move(shortOption),
		std::move(longOption),
		argcount,
		std::move(val)};
}